

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O2

void VP8LBackwardRefsClear(VP8LBackwardRefs *refs)

{
  PixOrCopyBlock *pPVar1;
  PixOrCopyBlock *ptr;
  
  VP8LClearBackwardRefs(refs);
  ptr = refs->free_blocks_;
  while (ptr != (PixOrCopyBlock *)0x0) {
    pPVar1 = ptr->next_;
    WebPSafeFree(ptr);
    refs->free_blocks_ = pPVar1;
    ptr = pPVar1;
  }
  return;
}

Assistant:

void VP8LBackwardRefsClear(VP8LBackwardRefs* const refs) {
  assert(refs != NULL);
  VP8LClearBackwardRefs(refs);
  while (refs->free_blocks_ != NULL) {
    PixOrCopyBlock* const next = refs->free_blocks_->next_;
    WebPSafeFree(refs->free_blocks_);
    refs->free_blocks_ = next;
  }
}